

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * cimg_library::CImg<unsigned_char>::default_LUT256(void)

{
  int iVar1;
  uchar *puVar2;
  uint local_24;
  uint local_20;
  uint b;
  uint g;
  uint r;
  uint index;
  
  if ((default_LUT256()::colormap == '\0') &&
     (iVar1 = __cxa_guard_acquire(&default_LUT256()::colormap), iVar1 != 0)) {
    CImg(&default_LUT256::colormap);
    __cxa_atexit(~CImg,&default_LUT256::colormap,&__dso_handle);
    __cxa_guard_release(&default_LUT256()::colormap);
  }
  cimg::mutex(8,1);
  puVar2 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&default_LUT256::colormap);
  if (puVar2 == (uchar *)0x0) {
    assign(&default_LUT256::colormap,1,0x100,1,3);
    g = 0;
    for (b = 0x10; b < 0x100; b = b + 0x20) {
      for (local_20 = 0x10; local_20 < 0x100; local_20 = local_20 + 0x20) {
        for (local_24 = 0x20; local_24 < 0x100; local_24 = local_24 + 0x40) {
          puVar2 = operator()(&default_LUT256::colormap,0,g,0);
          *puVar2 = (uchar)b;
          puVar2 = operator()(&default_LUT256::colormap,0,g,1);
          *puVar2 = (uchar)local_20;
          puVar2 = operator()(&default_LUT256::colormap,0,g,2);
          *puVar2 = (uchar)local_24;
          g = g + 1;
        }
      }
    }
  }
  cimg::mutex(8,0);
  return &default_LUT256::colormap;
}

Assistant:

static const CImg<Tuchar>& default_LUT256() {
      static CImg<Tuchar> colormap;
      cimg::mutex(8);
      if (!colormap) {
        colormap.assign(1,256,1,3);
        for (unsigned int index = 0, r = 16; r<256; r+=32)
          for (unsigned int g = 16; g<256; g+=32)
            for (unsigned int b = 32; b<256; b+=64) {
              colormap(0,index,0) = (Tuchar)r;
              colormap(0,index,1) = (Tuchar)g;
              colormap(0,index++,2) = (Tuchar)b;
            }
      }
      cimg::mutex(8,0);
      return colormap;
    }